

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O2

void ConcurrentCheckpoint::WriteRandomNumbers(DuckDB *db,bool *correct,size_t nr)

{
  char cVar1;
  unsigned_long __val;
  Connection con;
  long *local_110;
  bool *local_108;
  unsigned_long local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  Connection local_98 [32];
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  correct[nr] = true;
  local_108 = correct;
  duckdb::Connection::Connection(local_98,db);
  local_78 = "ROLLBACK";
  if ((nr & 1) == 0) {
    local_78 = "COMMIT";
  }
  local_100 = 0;
  for (__val = 0; __val != 200; __val = __val + 1) {
    std::__cxx11::string::string((string *)&local_70,"BEGIN TRANSACTION",(allocator *)&local_50);
    duckdb::Connection::Query((string *)&local_f8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_f8);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
    local_f8._M_dataplus._M_p = (pointer)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    std::__cxx11::to_string(&local_b8,local_100);
    std::operator+(&local_50,"UPDATE accounts SET money = money + ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
    std::operator+(&local_f8,&local_50," WHERE id = ");
    std::__cxx11::to_string(&local_d8,nr);
    std::operator+(&local_70,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    std::__cxx11::to_string(&local_b8,__val);
    std::operator+(&local_50,"UPDATE accounts SET money = money - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
    std::operator+(&local_f8,&local_50," WHERE id = ");
    std::__cxx11::to_string(&local_d8,nr);
    std::operator+(&local_70,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    std::__cxx11::to_string(&local_b8,local_100);
    std::operator+(&local_50,"UPDATE accounts SET money = money - ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
    std::operator+(&local_f8,&local_50," WHERE id = ");
    std::__cxx11::to_string(&local_d8,nr);
    std::operator+(&local_70,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    std::__cxx11::to_string(&local_b8,__val);
    std::operator+(&local_50,"UPDATE accounts SET money = money + ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
    std::operator+(&local_f8,&local_50," WHERE id = ");
    std::__cxx11::to_string(&local_d8,nr);
    std::operator+(&local_70,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_b8);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    std::__cxx11::string::string((string *)&local_70,local_78,(allocator *)&local_50);
    duckdb::Connection::Query((string *)&local_f8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_f8);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
    local_f8._M_dataplus._M_p = (pointer)0x0;
    std::__cxx11::string::~string((string *)&local_70);
    if (cVar1 != '\0') {
      local_108[nr] = false;
    }
    local_100 = local_100 + 2;
  }
  LOCK();
  finished_threads.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)finished_threads.super___atomic_base<unsigned_long>._M_i + 1);
  UNLOCK();
  if (finished_threads.super___atomic_base<unsigned_long>._M_i == 10) {
    LOCK();
    finished._M_base._M_i = (__atomic_base<bool>)true;
    UNLOCK();
  }
  duckdb::Connection::~Connection(local_98);
  return;
}

Assistant:

static void WriteRandomNumbers(DuckDB *db, bool *correct, size_t nr) {
		correct[nr] = true;
		Connection con(*db);
		for (size_t i = 0; i < CONCURRENT_UPDATE_TRANSACTION_UPDATE_COUNT; i++) {
			// just make some changes to the total
			// the total amount of money after the commit is the same
			if (con.Query("BEGIN TRANSACTION")->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			// we test both commit and rollback
			// the result of both should be the same since the updates have a
			// net-zero effect
			if (con.Query(nr % 2 == 0 ? "COMMIT" : "ROLLBACK")->HasError()) {
				correct[nr] = false;
			}
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}